

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O1

void Centaurus::emit_parser_epilog(X86Assembler *as,Label *rejectlabel)

{
  Label acceptlabel;
  Operand_ local_40;
  
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_40,as);
  ::asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(::asmjit::x86OpData + 0x480),
             (Operand_ *)(::asmjit::x86OpData + 0x4e0));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11e,&local_40);
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,rejectlabel);
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x189,(Operand_ *)(::asmjit::x86OpData + 0x480),0);
  ::asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(::asmjit::x86OpData + 0x4c0),
             (Operand_ *)(::asmjit::x86OpData + 0x510));
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&local_40);
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(::asmjit::x86OpData + 0x4b0));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(::asmjit::x86OpData + 0x490));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(::asmjit::x86OpData + 0x4a0));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(::asmjit::x86OpData + 0x4e0));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(::asmjit::x86OpData + 0x4f0));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(::asmjit::x86OpData + 0x4d0));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(::asmjit::x86OpData + 0x500));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(::asmjit::x86OpData + 0x510));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x276);
  return;
}

Assistant:

static void emit_parser_epilog(asmjit::X86Assembler& as, asmjit::Label& rejectlabel)
{
    asmjit::Label acceptlabel = as.newLabel();

    as.mov(asmjit::x86::rax, INPUT_REG);
    as.jmp(acceptlabel);

    //Jump to this label is a long jump. Discard everything on the stack.
    as.bind(rejectlabel);
    as.mov(asmjit::x86::rax, 0);
    as.mov(asmjit::x86::rsp, asmjit::x86::r9);

    as.bind(acceptlabel);

    as.pop(asmjit::x86::rbx);
    as.pop(asmjit::x86::rcx);
    as.pop(asmjit::x86::rdx);
    as.pop(asmjit::x86::rsi);
    as.pop(asmjit::x86::rdi);
    as.pop(asmjit::x86::rbp);
    as.pop(asmjit::x86::r8);
    as.pop(asmjit::x86::r9);

    as.ret();
}